

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O2

bool __thiscall
FOptionMenuItemControl::MenuEvent(FOptionMenuItemControl *this,int mkey,bool fromcontroller)

{
  if (mkey == 8) {
    FKeyBindings::UnbindACommand
              (this->mBindings,
               FName::NameData.NameArray
               [(this->super_FOptionMenuItem).super_FListMenuItem.mAction.Index].Text);
  }
  else if (mkey == 0xb) {
    this->mWaiting = false;
  }
  else {
    if (mkey != 10) {
      return false;
    }
    this->mWaiting = false;
    FKeyBindings::SetBind
              (this->mBindings,this->mInput,
               FName::NameData.NameArray
               [(this->super_FOptionMenuItem).super_FListMenuItem.mAction.Index].Text);
  }
  return true;
}

Assistant:

bool MenuEvent(int mkey, bool fromcontroller)
	{
		if (mkey == MKEY_Input)
		{
			mWaiting = false;
			mBindings->SetBind(mInput, mAction);
			return true;
		}
		else if (mkey == MKEY_Clear)
		{
			mBindings->UnbindACommand(mAction);
			return true;
		}
		else if (mkey == MKEY_Abort)
		{
			mWaiting = false;
			return true;
		}
		return false;
	}